

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepScanLineHuge.cpp
# Opt level: O1

void anon_unknown.dwarf_11b4fe::readWriteTest
               (int channelCount,int testTimes,bool random_channel_data,string *fn)

{
  PixelType PVar1;
  size_t __n;
  undefined1 auVar2 [16];
  Array2D<void_*> *pAVar3;
  char cVar4;
  int j_2;
  int iVar5;
  uint uVar6;
  ostream *poVar7;
  string *psVar8;
  undefined8 *puVar9;
  void *pvVar10;
  void *pvVar11;
  undefined8 *puVar12;
  float *pfVar13;
  float *pfVar14;
  int *piVar15;
  ChannelList *this;
  ChannelList *pCVar16;
  ushort uVar17;
  undefined4 uVar18;
  uint uVar19;
  float fVar20;
  void ***pppvVar21;
  int j_1;
  Compression CVar22;
  PixelType PVar23;
  undefined4 in_register_00000034;
  long lVar24;
  int j;
  ulong uVar25;
  ushort uVar26;
  long lVar27;
  ulong uVar28;
  int iVar29;
  long lVar30;
  long lVar31;
  float fVar32;
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  int iVar38;
  Array<Imf_3_2::Array2D<void_*>_> data;
  DeepScanLineOutputFile file;
  int type;
  undefined4 uStack_28c;
  _Base_ptr local_280 [2];
  undefined8 *local_270;
  int local_268;
  int local_264;
  DeepFrameBuffer frameBuffer;
  Channel local_1f0 [56];
  stringstream ss;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  local_270 = (undefined8 *)CONCAT44(in_register_00000034,testTimes);
  local_264 = channelCount;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing files with ",0x13);
  poVar7 = (ostream *)std::ostream::operator<<(&std::cout,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," channels ",10);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," times.",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::ostream::flush();
  uVar28 = 0;
  do {
    local_268 = (int)uVar28;
    CVar22 = local_268 + (int)(uVar28 / 3) * -3;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"generating ... ",0xf);
    std::ostream::flush();
    frameBuffer._map._M_t._M_impl._0_8_ = 0;
    Imf_3_2::Header::Header
              ((Header *)&ss,(Box *)(anonymous_namespace)::displayWindow,
               (Box *)&(anonymous_namespace)::dataWindow,1.0,(Vec2 *)&frameBuffer,1.0,INCREASING_Y,
               CVar22);
    Imf_3_2::Header::operator=((Header *)(anonymous_namespace)::header,(Header *)&ss);
    Imf_3_2::Header::~Header((Header *)&ss);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"compression ",0xc);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cout,CVar22);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    std::ostream::flush();
    if (DAT_001ef428._M_current != (anonymous_namespace)::channelTypes) {
      DAT_001ef428._M_current = (anonymous_namespace)::channelTypes;
    }
    iVar29 = 0;
    do {
      type = random_int(3);
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      std::ostream::operator<<(local_1a8,iVar29);
      std::__cxx11::stringbuf::str();
      if (type == 0) {
        psVar8 = (string *)Imf_3_2::Header::channels();
        Imf_3_2::Channel::Channel(local_1f0,UINT,1,1,false);
        Imf_3_2::ChannelList::insert(psVar8,(Channel *)&frameBuffer);
      }
      if (type == 1) {
        psVar8 = (string *)Imf_3_2::Header::channels();
        Imf_3_2::Channel::Channel(local_1f0,HALF,1,1,false);
        Imf_3_2::ChannelList::insert(psVar8,(Channel *)&frameBuffer);
      }
      if (type == 2) {
        psVar8 = (string *)Imf_3_2::Header::channels();
        Imf_3_2::Channel::Channel(local_1f0,FLOAT,1,1,false);
        Imf_3_2::ChannelList::insert(psVar8,(Channel *)&frameBuffer);
      }
      if (DAT_001ef428._M_current == DAT_001ef430) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&(anonymous_namespace)::channelTypes,
                   DAT_001ef428,&type);
      }
      else {
        *DAT_001ef428._M_current = type;
        DAT_001ef428._M_current = DAT_001ef428._M_current + 1;
      }
      if ((_Base_ptr *)frameBuffer._map._M_t._M_impl._0_8_ !=
          &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)frameBuffer._map._M_t._M_impl._0_8_,
                        (ulong)((long)&(frameBuffer._map._M_t._M_impl.super__Rb_tree_header.
                                        _M_header._M_parent)->_M_color + 1));
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      std::ios_base::~ios_base(local_138);
      iVar29 = iVar29 + 1;
    } while (iVar29 != 10);
    Imf_3_2::Header::setType((string *)(anonymous_namespace)::header);
    puVar9 = (undefined8 *)operator_new__(0xf8);
    *puVar9 = 10;
    memset((Array2D<void_*> *)(puVar9 + 1),0,0xf0);
    data._size = 10;
    lVar27 = 0x10;
    data._data = (Array2D<void_*> *)(puVar9 + 1);
    do {
      pAVar3 = data._data;
      pvVar10 = operator_new__(0x10008);
      pvVar11 = *(void **)((long)&pAVar3->_sizeX + lVar27);
      if (pvVar11 != (void *)0x0) {
        operator_delete__(pvVar11);
      }
      *(undefined8 *)((long)pAVar3 + lVar27 + -0x10) = 1;
      *(undefined8 *)((long)pAVar3 + lVar27 + -8) = 0x2001;
      *(void **)((long)&pAVar3->_sizeX + lVar27) = pvVar10;
      lVar27 = lVar27 + 0x18;
    } while (lVar27 != 0x100);
    pvVar11 = operator_new__(0x8004);
    if ((anonymous_namespace)::sampleCount._16_8_ != 0) {
      operator_delete__((void *)(anonymous_namespace)::sampleCount._16_8_);
    }
    puVar9 = local_270;
    (anonymous_namespace)::sampleCount._0_8_ = 1;
    (anonymous_namespace)::sampleCount._8_8_ = 0x2001;
    (anonymous_namespace)::sampleCount._16_8_ = pvVar11;
    remove((char *)*local_270);
    Imf_3_2::DeepScanLineOutputFile::DeepScanLineOutputFile
              (&file,(char *)*puVar9,(Header *)(anonymous_namespace)::header,8);
    frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
    frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    Imf_3_2::Slice::Slice(&frameBuffer._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,false,false);
    Imf_3_2::Slice::Slice
              ((Slice *)&ss,UINT,
               (char *)((anonymous_namespace)::sampleCount._16_8_ +
                        (long)(anonymous_namespace)::dataWindow * -4 + (long)DAT_001ef404 * -0x8004)
               ,4,0x8004,1,1,0.0,false,false);
    Imf_3_2::DeepFrameBuffer::insertSampleCountSlice((Slice *)&frameBuffer);
    lVar27 = 0;
    lVar30 = 0;
    uVar28 = 0;
    do {
      PVar1 = (anonymous_namespace)::channelTypes[lVar30];
      PVar23 = (uint)(PVar1 != UINT) * 3;
      if (PVar1 == HALF) {
        PVar23 = PVar1;
      }
      if (PVar1 == FLOAT) {
        PVar23 = PVar1;
      }
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      std::ostream::operator<<(local_1a8,(int)lVar30);
      std::__cxx11::stringbuf::str();
      iVar29 = (anonymous_namespace)::channelTypes[lVar30];
      uVar25 = (ulong)(iVar29 == 0) << 2;
      if (iVar29 == 1) {
        uVar25 = 2;
      }
      if (iVar29 == 2) {
        uVar25 = 4;
      }
      Imf_3_2::DeepSlice::DeepSlice
                ((DeepSlice *)local_1f0,PVar23,
                 (char *)(*(long *)((long)&(data._data)->_data + lVar27) +
                          (long)(anonymous_namespace)::dataWindow * -8 +
                         (long)DAT_001ef404 * -0x10008),8,0x10008,uVar25,1,1,0.0,false,false);
      Imf_3_2::DeepFrameBuffer::insert((string *)&frameBuffer,(DeepSlice *)&type);
      if ((_Base_ptr *)CONCAT44(uStack_28c,type) != local_280) {
        operator_delete((_Base_ptr *)CONCAT44(uStack_28c,type),
                        (ulong)((long)&local_280[0]->_M_color + 1));
      }
      uVar28 = uVar28 + uVar25;
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      std::ios_base::~ios_base(local_138);
      lVar30 = lVar30 + 1;
      lVar27 = lVar27 + 0x18;
    } while (lVar30 != 10);
    Imf_3_2::DeepScanLineOutputFile::setFrameBuffer((DeepFrameBuffer *)&file);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing file ",0xd);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar28;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  generating approx. ",0x15);
    iVar29 = SUB164((ZEXT816(0) << 0x40 | ZEXT816(0x1fff0)) / auVar2,0);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cout,iVar29);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," samples per pixel\n",0x13);
    lVar27 = 0;
    lVar30 = 0;
    do {
      iVar5 = random_int(4000);
      uVar6 = iVar5 + iVar29 + -2000;
      *(uint *)((anonymous_namespace)::sampleCount._16_8_ + lVar27 * 4) = uVar6;
      lVar30 = lVar30 + (ulong)uVar6;
      lVar27 = lVar27 + 1;
    } while (lVar27 != 0x2001);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  total number of samples: ",0x1b);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  storage required: ",0x14);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," bytes (",8);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"GiB)",4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &(anonymous_namespace)::storage,lVar30 * uVar28);
    uVar28 = 0;
    lVar27 = 0;
    do {
      iVar29 = (int)uVar28 + (int)((uVar28 & 0xffffffff) / 0x801) * -0x801;
      fVar32 = (float)iVar29;
      uVar19 = (uint)fVar32 & 0x7fffff | 0x800000;
      cVar4 = (char)((uint)fVar32 >> 0x17);
      uVar6 = (uint)fVar32 >> 0xd & 0x3ff;
      uVar17 = (ushort)uVar6 | 0x7c00 | (ushort)(uVar6 == 0);
      uVar26 = (ushort)((int)fVar32 + 0x8000fff + (uint)(((uint)fVar32 >> 0xd & 1) != 0) >> 0xd);
      if (0x477fefff < (uint)fVar32) {
        uVar26 = 0x7c00;
      }
      if (fVar32 == INFINITY) {
        uVar17 = 0x7c00;
      }
      if ((uint)fVar32 < 0x7f800000) {
        uVar17 = uVar26;
      }
      uVar26 = (ushort)(0x80000000 < uVar19 << (cVar4 + 0xa2U & 0x1f)) +
               (short)(uVar19 >> (0x7eU - cVar4 & 0x1f));
      if ((uint)fVar32 < 0x33000001) {
        uVar26 = 0;
      }
      if (0x387fffff < (uint)fVar32) {
        uVar26 = uVar17;
      }
      lVar30 = 0;
      do {
        data._data[lVar30]._data[uVar28] = (void *)((anonymous_namespace)::storage + lVar27);
        pvVar11 = (void *)(anonymous_namespace)::sampleCount._16_8_;
        piVar15 = (anonymous_namespace)::channelTypes;
        iVar5 = (anonymous_namespace)::channelTypes[lVar30];
        if (iVar5 == 0) {
          lVar27 = lVar27 + (ulong)*(uint *)((anonymous_namespace)::sampleCount._16_8_ + uVar28 * 4)
                            * 4;
        }
        if (iVar5 == 1) {
          lVar27 = lVar27 + (ulong)*(uint *)((anonymous_namespace)::sampleCount._16_8_ + uVar28 * 4)
                            * 2;
        }
        if (iVar5 == 2) {
          lVar27 = lVar27 + (ulong)*(uint *)((anonymous_namespace)::sampleCount._16_8_ + uVar28 * 4)
                            * 4;
        }
        iVar5 = *(int *)((anonymous_namespace)::sampleCount._16_8_ + uVar28 * 4);
        if ((char)local_264 == '\0') {
          if (iVar5 != 0) {
            pppvVar21 = &data._data[lVar30]._data;
            uVar25 = 0;
            do {
              if (piVar15[lVar30] == 0) {
                *(int *)((long)(*pppvVar21)[uVar28] + uVar25 * 4) = iVar29;
              }
              iVar5 = piVar15[lVar30];
              if (iVar5 == 2) {
                *(float *)((long)(*pppvVar21)[uVar28] + uVar25 * 4) = fVar32;
              }
              else if (iVar5 == 1) {
                *(ushort *)((long)(*pppvVar21)[uVar28] + uVar25 * 2) = uVar26;
              }
              uVar25 = uVar25 + 1;
            } while (uVar25 < *(uint *)((long)pvVar11 + uVar28 * 4));
          }
        }
        else if (iVar5 != 0) {
          uVar25 = 0;
          do {
            if ((anonymous_namespace)::channelTypes[lVar30] == 0) {
              iVar5 = random_int(0x7fffffff);
              pvVar11 = data._data[lVar30]._data[uVar28];
              *(int *)((long)pvVar11 + uVar25 * 4) = iVar5;
            }
            if ((anonymous_namespace)::channelTypes[lVar30] == 1) {
              fVar33 = random_float(3.4028235e+38);
              fVar20 = ABS(fVar33);
              uVar17 = (ushort)((uint)fVar33 >> 0x10) & 0x8000;
              if ((uint)fVar20 < 0x38800000) {
                if ((0x33000000 < (uint)fVar20) &&
                   (uVar6 = (uint)fVar33 & 0x7fffff | 0x800000, cVar4 = (char)((uint)fVar20 >> 0x17)
                   , uVar17 = uVar17 | (ushort)(uVar6 >> (0x7eU - cVar4 & 0x1f)),
                   0x80000000 < uVar6 << (cVar4 + 0xa2U & 0x1f))) {
                  uVar17 = uVar17 + 1;
                }
              }
              else if ((uint)fVar20 < 0x7f800000) {
                if ((uint)fVar20 < 0x477ff000) {
                  uVar17 = (ushort)((int)fVar20 + 0x8000fffU +
                                    (uint)(((uint)fVar20 >> 0xd & 1) != 0) >> 0xd) | uVar17;
                }
                else {
                  uVar17 = uVar17 | 0x7c00;
                }
              }
              else {
                uVar17 = uVar17 | 0x7c00;
                if (fVar20 != INFINITY) {
                  uVar6 = (uint)fVar20 >> 0xd & 0x3ff;
                  uVar17 = uVar17 | (ushort)uVar6 | (ushort)(uVar6 == 0);
                }
              }
              pvVar11 = data._data[lVar30]._data[uVar28];
              *(ushort *)((long)pvVar11 + uVar25 * 2) = uVar17;
            }
            if ((anonymous_namespace)::channelTypes[lVar30] == 2) {
              fVar20 = random_float(3.4028235e+38);
              *(float *)((long)data._data[lVar30]._data[uVar28] + uVar25 * 4) = fVar20;
            }
            uVar25 = uVar25 + 1;
          } while (uVar25 < *(uint *)((anonymous_namespace)::sampleCount._16_8_ + uVar28 * 4));
        }
        uVar18 = SUB84(pvVar11,0);
        lVar30 = lVar30 + 1;
      } while (lVar30 != 10);
      uVar28 = uVar28 + 1;
    } while (uVar28 != 0x2001);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," data prepared, writing ...",0x1b);
    Imf_3_2::DeepScanLineOutputFile::writePixels((int)&file);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," data written\n",0xe);
    std::
    _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
                 *)&frameBuffer);
    Imf_3_2::DeepScanLineOutputFile::~DeepScanLineOutputFile(&file);
    Imf_3_2::Array<Imf_3_2::Array2D<void_*>_>::~Array(&data);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading \n",9);
    std::ostream::flush();
    Imf_3_2::DeepScanLineInputFile::DeepScanLineInputFile
              ((DeepScanLineInputFile *)&data,(char *)*local_270,8);
    Imf_3_2::DeepScanLineInputFile::header();
    puVar9 = (undefined8 *)Imf_3_2::Header::displayWindow();
    puVar12 = (undefined8 *)Imf_3_2::Header::displayWindow();
    iVar29 = -(uint)((int)*puVar12 == (int)*puVar9);
    iVar5 = -(uint)((int)((ulong)*puVar12 >> 0x20) == (int)((ulong)*puVar9 >> 0x20));
    auVar34._4_4_ = iVar29;
    auVar34._0_4_ = iVar29;
    auVar34._8_4_ = iVar5;
    auVar34._12_4_ = iVar5;
    iVar29 = movmskpd(uVar18,auVar34);
    if ((iVar29 != 3) ||
       (iVar5 = -(uint)((int)puVar12[1] == (int)puVar9[1]),
       iVar38 = -(uint)((int)((ulong)puVar12[1] >> 0x20) == (int)((ulong)puVar9[1] >> 0x20)),
       auVar35._4_4_ = iVar5, auVar35._0_4_ = iVar5, auVar35._8_4_ = iVar38, auVar35._12_4_ = iVar38
       , iVar5 = movmskpd((int)puVar12,auVar35), iVar5 != 3)) {
      __assert_fail("fileHeader.displayWindow () == header.displayWindow ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineHuge.cpp"
                    ,0xf8,"void (anonymous namespace)::readFile(int, bool, const std::string &)");
    }
    puVar9 = (undefined8 *)Imf_3_2::Header::dataWindow();
    puVar12 = (undefined8 *)Imf_3_2::Header::dataWindow();
    iVar5 = -(uint)((int)*puVar12 == (int)*puVar9);
    iVar38 = -(uint)((int)((ulong)*puVar12 >> 0x20) == (int)((ulong)*puVar9 >> 0x20));
    auVar36._4_4_ = iVar5;
    auVar36._0_4_ = iVar5;
    auVar36._8_4_ = iVar38;
    auVar36._12_4_ = iVar38;
    iVar29 = movmskpd(iVar29,auVar36);
    if ((iVar29 != 3) ||
       (iVar29 = -(uint)((int)puVar12[1] == (int)puVar9[1]),
       iVar5 = -(uint)((int)((ulong)puVar12[1] >> 0x20) == (int)((ulong)puVar9[1] >> 0x20)),
       auVar37._4_4_ = iVar29, auVar37._0_4_ = iVar29, auVar37._8_4_ = iVar5, auVar37._12_4_ = iVar5
       , iVar29 = movmskpd((int)puVar12,auVar37), iVar29 != 3)) {
      __assert_fail("fileHeader.dataWindow () == header.dataWindow ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineHuge.cpp"
                    ,0xf9,"void (anonymous namespace)::readFile(int, bool, const std::string &)");
    }
    pfVar13 = (float *)Imf_3_2::Header::pixelAspectRatio();
    fVar32 = *pfVar13;
    pfVar13 = (float *)Imf_3_2::Header::pixelAspectRatio();
    if ((fVar32 != *pfVar13) || (NAN(fVar32) || NAN(*pfVar13))) {
      __assert_fail("fileHeader.pixelAspectRatio () == header.pixelAspectRatio ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineHuge.cpp"
                    ,0xfa,"void (anonymous namespace)::readFile(int, bool, const std::string &)");
    }
    pfVar13 = (float *)Imf_3_2::Header::screenWindowCenter();
    pfVar14 = (float *)Imf_3_2::Header::screenWindowCenter();
    if ((((*pfVar13 != *pfVar14) || (NAN(*pfVar13) || NAN(*pfVar14))) || (pfVar13[1] != pfVar14[1]))
       || (NAN(pfVar13[1]) || NAN(pfVar14[1]))) {
      __assert_fail("fileHeader.screenWindowCenter () == header.screenWindowCenter ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineHuge.cpp"
                    ,0xfb,"void (anonymous namespace)::readFile(int, bool, const std::string &)");
    }
    pfVar13 = (float *)Imf_3_2::Header::screenWindowWidth();
    fVar32 = *pfVar13;
    pfVar13 = (float *)Imf_3_2::Header::screenWindowWidth();
    if ((fVar32 != *pfVar13) || (NAN(fVar32) || NAN(*pfVar13))) {
      __assert_fail("fileHeader.screenWindowWidth () == header.screenWindowWidth ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineHuge.cpp"
                    ,0xfc,"void (anonymous namespace)::readFile(int, bool, const std::string &)");
    }
    piVar15 = (int *)Imf_3_2::Header::lineOrder();
    iVar29 = *piVar15;
    piVar15 = (int *)Imf_3_2::Header::lineOrder();
    if (iVar29 != *piVar15) {
      __assert_fail("fileHeader.lineOrder () == header.lineOrder ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineHuge.cpp"
                    ,0xfd,"void (anonymous namespace)::readFile(int, bool, const std::string &)");
    }
    piVar15 = (int *)Imf_3_2::Header::compression();
    iVar29 = *piVar15;
    piVar15 = (int *)Imf_3_2::Header::compression();
    if (iVar29 != *piVar15) {
      __assert_fail("fileHeader.compression () == header.compression ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineHuge.cpp"
                    ,0xfe,"void (anonymous namespace)::readFile(int, bool, const std::string &)");
    }
    this = (ChannelList *)Imf_3_2::Header::channels();
    pCVar16 = (ChannelList *)Imf_3_2::Header::channels();
    cVar4 = Imf_3_2::ChannelList::operator==(this,pCVar16);
    if (cVar4 == '\0') {
      __assert_fail("fileHeader.channels () == header.channels ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineHuge.cpp"
                    ,0xff,"void (anonymous namespace)::readFile(int, bool, const std::string &)");
    }
    puVar9 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
    puVar12 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
    __n = puVar9[1];
    if ((__n != puVar12[1]) ||
       ((__n != 0 && (iVar29 = bcmp((void *)*puVar9,(void *)*puVar12,__n), iVar29 != 0)))) {
      __assert_fail("fileHeader.type () == header.type ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineHuge.cpp"
                    ,0x100,"void (anonymous namespace)::readFile(int, bool, const std::string &)");
    }
    pvVar11 = operator_new__(0x8004);
    puVar9 = (undefined8 *)operator_new__(0xf8);
    *puVar9 = 10;
    puVar12 = puVar9 + 1;
    memset(puVar12,0,0xf0);
    _file = (_Base_ptr)0xa;
    lVar27 = 0x10;
    do {
      pvVar10 = operator_new__(0x10008);
      if (*(void **)((long)puVar12 + lVar27) != (void *)0x0) {
        operator_delete__(*(void **)((long)puVar12 + lVar27));
      }
      *(undefined8 *)((long)puVar9 + lVar27 + -8) = 1;
      *(undefined8 *)((long)puVar9 + lVar27) = 0x2001;
      *(void **)((long)puVar12 + lVar27) = pvVar10;
      lVar27 = lVar27 + 0x18;
    } while (lVar27 != 0x100);
    frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
    frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    Imf_3_2::Slice::Slice(&frameBuffer._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,false,false);
    Imf_3_2::Slice::Slice
              ((Slice *)&ss,UINT,
               (char *)((long)pvVar11 +
                       (long)DAT_001ef404 * -0x8004 + (long)(anonymous_namespace)::dataWindow * -4),
               4,0x8004,1,1,0.0,false,false);
    Imf_3_2::DeepFrameBuffer::insertSampleCountSlice((Slice *)&frameBuffer);
    lVar27 = 0;
    lVar31 = 0;
    lVar30 = 0;
    do {
      PVar1 = (anonymous_namespace)::channelTypes[lVar31];
      PVar23 = (uint)(PVar1 != UINT) * 3;
      if (PVar1 == HALF) {
        PVar23 = PVar1;
      }
      if (PVar1 == FLOAT) {
        PVar23 = PVar1;
      }
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      std::ostream::operator<<(local_1a8,(int)lVar31);
      std::__cxx11::stringbuf::str();
      iVar29 = (anonymous_namespace)::channelTypes[lVar31];
      uVar28 = (ulong)(iVar29 == 0) << 2;
      if (iVar29 == 1) {
        uVar28 = 2;
      }
      if (iVar29 == 2) {
        uVar28 = 4;
      }
      Imf_3_2::DeepSlice::DeepSlice
                ((DeepSlice *)local_1f0,PVar23,
                 (char *)(*(long *)((long)puVar9 + lVar27 + 0x18) +
                          (long)(anonymous_namespace)::dataWindow * -8 +
                         (long)DAT_001ef404 * -0x10008),8,0x10008,uVar28,1,1,0.0,false,false);
      Imf_3_2::DeepFrameBuffer::insert((string *)&frameBuffer,(DeepSlice *)&type);
      if ((_Base_ptr *)CONCAT44(uStack_28c,type) != local_280) {
        operator_delete((_Base_ptr *)CONCAT44(uStack_28c,type),
                        (ulong)((long)&local_280[0]->_M_color + 1));
      }
      lVar30 = lVar30 + uVar28;
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      std::ios_base::~ios_base(local_138);
      lVar31 = lVar31 + 1;
      lVar27 = lVar27 + 0x18;
    } while (lVar31 != 10);
    Imf_3_2::DeepScanLineInputFile::setFrameBuffer((DeepFrameBuffer *)&data);
    Imf_3_2::DeepScanLineInputFile::readPixelSampleCounts
              ((int)(DeepFrameBuffer *)&data,DAT_001ef404);
    if (DAT_001ef40c < DAT_001ef404) {
      lVar31 = 0;
    }
    else {
      uVar28 = 0;
      lVar31 = 0;
      lVar27 = (anonymous_namespace)::sampleCount._16_8_;
      pvVar10 = pvVar11;
      do {
        lVar24 = 0;
        do {
          uVar6 = *(uint *)((long)pvVar10 + lVar24 * 4);
          if (uVar6 != *(uint *)(lVar27 + lVar24 * 4)) {
            __assert_fail("localSampleCount[i][j] == sampleCount[i][j]",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineHuge.cpp"
                          ,0x139,
                          "void (anonymous namespace)::readFile(int, bool, const std::string &)");
          }
          lVar31 = lVar31 + (ulong)uVar6;
          lVar24 = lVar24 + 1;
        } while (lVar24 != 0x2001);
        uVar28 = uVar28 + 1;
        lVar27 = lVar27 + (anonymous_namespace)::sampleCount._8_8_ * 4;
        pvVar10 = (void *)((long)pvVar10 + 0x8004);
      } while (uVar28 != (DAT_001ef40c - DAT_001ef404) + 1);
    }
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&ss,lVar31 * lVar30,
               (allocator_type *)local_1f0);
    lVar30 = 0;
    lVar27 = 0;
    do {
      lVar31 = 0;
      lVar24 = 0;
      do {
        *(long *)(*(long *)((long)puVar9 + lVar31 + 0x18) + lVar30 * 8) = (long)_ss + lVar27;
        iVar29 = (anonymous_namespace)::channelTypes[lVar24];
        if (iVar29 == 0) {
          lVar27 = lVar27 + (ulong)*(uint *)((anonymous_namespace)::sampleCount._16_8_ + lVar30 * 4)
                            * 4;
        }
        if (iVar29 == 1) {
          lVar27 = lVar27 + (ulong)*(uint *)((anonymous_namespace)::sampleCount._16_8_ + lVar30 * 4)
                            * 2;
        }
        if (iVar29 == 2) {
          lVar27 = lVar27 + (ulong)*(uint *)((anonymous_namespace)::sampleCount._16_8_ + lVar30 * 4)
                            * 4;
        }
        lVar24 = lVar24 + 1;
        lVar31 = lVar31 + 0x18;
      } while (lVar24 != 10);
      lVar30 = lVar30 + 1;
    } while (lVar30 != 0x2001);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"reading image data ... ",0x17);
    std::ostream::flush();
    Imf_3_2::DeepScanLineInputFile::readPixels((int)&data,DAT_001ef404);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," image read \n",0xd);
    std::ostream::flush();
    if (_ss != (void *)0x0) {
      operator_delete(_ss,local_1a8[0] - (long)_ss);
    }
    std::
    _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
                 *)&frameBuffer);
    Imf_3_2::Array<Imf_3_2::Array2D<void_*>_>::~Array((Array<Imf_3_2::Array2D<void_*>_> *)&file);
    operator_delete__(pvVar11);
    Imf_3_2::DeepScanLineInputFile::~DeepScanLineInputFile((DeepScanLineInputFile *)&data);
    remove((char *)*local_270);
    uVar28 = (ulong)(local_268 + 1U);
  } while (local_268 + 1U != 5);
  return;
}

Assistant:

void
readWriteTest (
    int                channelCount,
    int                testTimes,
    bool               random_channel_data,
    const std::string& fn)
{
    cout << "Testing files with " << channelCount << " channels " << testTimes
         << " times." << endl
         << flush;
    for (int i = 0; i < testTimes; i++)
    {
        int         compressionIndex = i % 3;
        Compression compression;
        switch (compressionIndex)
        {
            case 0: compression = NO_COMPRESSION; break;
            case 1: compression = RLE_COMPRESSION; break;
            case 2: compression = ZIPS_COMPRESSION; break;
        }

        generateRandomFile (channelCount, compression, random_channel_data, fn);
        readFile (channelCount, false, fn);
        remove (fn.c_str ());
    }
}